

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_internal.h
# Opt level: O2

ImGuiTabBar * __thiscall ImPool<ImGuiTabBar>::Add(ImPool<ImGuiTabBar> *this)

{
  int i;
  int iVar1;
  ImGuiTabBar *pIVar2;
  
  i = this->FreeIdx;
  if (i == (this->Buf).Size) {
    ImVector<ImGuiTabBar>::resize(&this->Buf,i + 1);
    iVar1 = this->FreeIdx + 1;
  }
  else {
    pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
    iVar1 = (pIVar2->Tabs).Size;
  }
  this->FreeIdx = iVar1;
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  ImGuiTabBar::ImGuiTabBar(pIVar2);
  pIVar2 = ImVector<ImGuiTabBar>::operator[](&this->Buf,i);
  return pIVar2;
}

Assistant:

T*          Add()                               { int idx = FreeIdx; if (idx == Buf.Size) { Buf.resize(Buf.Size + 1); FreeIdx++; } else { FreeIdx = *(int*)&Buf[idx]; } IM_PLACEMENT_NEW(&Buf[idx]) T(); return &Buf[idx]; }